

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_weapons.cpp
# Opt level: O2

bool __thiscall AWeapon::Use(AWeapon *this,bool pickup)

{
  TObjPtr<AWeapon> *obj;
  AWeapon *pAVar1;
  AActor *pAVar2;
  AInventory *pAVar3;
  AWeapon *pAVar4;
  TObjPtr<AActor> *obj_00;
  AWeapon *useweap;
  
  if (((this->super_AStateProvider).super_AInventory.field_0x4fd & 4) == 0) {
    obj = &this->SisterWeapon;
    pAVar1 = GC::ReadBarrier<AWeapon>((AWeapon **)obj);
    pAVar4 = this;
    if ((pAVar1 != (AWeapon *)0x0) &&
       (pAVar1 = GC::ReadBarrier<AWeapon>((AWeapon **)obj),
       ((pAVar1->super_AStateProvider).super_AInventory.field_0x4fd & 4) != 0)) {
      pAVar2 = GC::ReadBarrier<AActor>
                         ((AActor **)&(this->super_AStateProvider).super_AInventory.Owner);
      pAVar3 = AActor::FindInventory
                         (pAVar2,(PClassActor *)APowerWeaponLevel2::RegistrationInfo.MyClass,true);
      if (pAVar3 != (AInventory *)0x0) {
        pAVar4 = GC::ReadBarrier<AWeapon>((AWeapon **)obj);
      }
    }
    obj_00 = &(this->super_AStateProvider).super_AInventory.Owner;
    pAVar2 = GC::ReadBarrier<AActor>((AActor **)obj_00);
    if ((pAVar2->player != (player_t *)0x0) &&
       (pAVar2 = GC::ReadBarrier<AActor>((AActor **)obj_00), pAVar2->player->ReadyWeapon != pAVar4))
    {
      pAVar2 = GC::ReadBarrier<AActor>((AActor **)obj_00);
      pAVar2->player->PendingWeapon = pAVar4;
    }
  }
  return false;
}

Assistant:

bool AWeapon::Use (bool pickup)
{
	AWeapon *useweap = this;

	// Powered up weapons cannot be used directly.
	if (WeaponFlags & WIF_POWERED_UP) return false;

	// If the player is powered-up, use the alternate version of the
	// weapon, if one exists.
	if (SisterWeapon != NULL &&
		SisterWeapon->WeaponFlags & WIF_POWERED_UP &&
		Owner->FindInventory (RUNTIME_CLASS(APowerWeaponLevel2), true))
	{
		useweap = SisterWeapon;
	}
	if (Owner->player != NULL && Owner->player->ReadyWeapon != useweap)
	{
		Owner->player->PendingWeapon = useweap;
	}
	// Return false so that the weapon is not removed from the inventory.
	return false;
}